

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

optional<CNetAddr> *
LookupHost(optional<CNetAddr> *__return_storage_ptr__,string *name,bool fAllowLookup,
          DNSLookupFn dns_lookup_function)

{
  long lVar1;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_RCX;
  long in_FS_OFFSET;
  DNSLookupFn in_stack_ffffffffffffff98;
  vector<CNetAddr,_std::allocator<CNetAddr>_> addresses;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              *)&stack0xffffffffffffffa0,in_RCX);
  LookupHost(&addresses,name,1,fAllowLookup,in_stack_ffffffffffffff98);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffa0);
  if (addresses.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
      super__Vector_impl_data._M_start ==
      addresses.super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Optional_base<CNetAddr,_false,_false>)._M_payload.
    super__Optional_payload<CNetAddr,_true,_false,_false>.super__Optional_payload_base<CNetAddr>.
    _M_engaged = false;
  }
  else {
    std::_Optional_payload_base<CNetAddr>::_Optional_payload_base<CNetAddr_const&>
              ((_Optional_payload_base<CNetAddr> *)__return_storage_ptr__);
  }
  std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector(&addresses);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CNetAddr> LookupHost(const std::string& name, bool fAllowLookup, DNSLookupFn dns_lookup_function)
{
    const std::vector<CNetAddr> addresses{LookupHost(name, 1, fAllowLookup, dns_lookup_function)};
    return addresses.empty() ? std::nullopt : std::make_optional(addresses.front());
}